

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

void pospopcnt_u8_avx2_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  ulong uVar1;
  uint8_t *data_00;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar40 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar41 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar42 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar43 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  
  auVar37._8_8_ = 0x5555555555555555;
  auVar37._0_8_ = 0x5555555555555555;
  auVar37._16_8_ = 0x5555555555555555;
  auVar37._24_8_ = 0x5555555555555555;
  auVar16._8_8_ = 0xaaaaaaaaaaaaaaaa;
  auVar16._0_8_ = 0xaaaaaaaaaaaaaaaa;
  auVar16._16_8_ = 0xaaaaaaaaaaaaaaaa;
  auVar16._24_8_ = 0xaaaaaaaaaaaaaaaa;
  auVar17._8_8_ = 0x3333333333333333;
  auVar17._0_8_ = 0x3333333333333333;
  auVar17._16_8_ = 0x3333333333333333;
  auVar17._24_8_ = 0x3333333333333333;
  auVar18._8_8_ = 0xcccccccccccccccc;
  auVar18._0_8_ = 0xcccccccccccccccc;
  auVar18._16_8_ = 0xcccccccccccccccc;
  auVar18._24_8_ = 0xcccccccccccccccc;
  auVar38[8] = 0xf;
  auVar38._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar38[9] = 0xf;
  auVar38[10] = 0xf;
  auVar38[0xb] = 0xf;
  auVar38[0xc] = 0xf;
  auVar38[0xd] = 0xf;
  auVar38[0xe] = 0xf;
  auVar38[0xf] = 0xf;
  auVar38[0x10] = 0xf;
  auVar38[0x11] = 0xf;
  auVar38[0x12] = 0xf;
  auVar38[0x13] = 0xf;
  auVar38[0x14] = 0xf;
  auVar38[0x15] = 0xf;
  auVar38[0x16] = 0xf;
  auVar38[0x17] = 0xf;
  auVar38[0x18] = 0xf;
  auVar38[0x19] = 0xf;
  auVar38[0x1a] = 0xf;
  auVar38[0x1b] = 0xf;
  auVar38[0x1c] = 0xf;
  auVar38[0x1d] = 0xf;
  auVar38[0x1e] = 0xf;
  auVar38[0x1f] = 0xf;
  auVar4 = vbroadcasti32x4_avx512vl(_DAT_00114170);
  uVar1 = len & 0xffffffffffffff80;
  auVar22 = ZEXT1664((undefined1  [16])0x0);
  auVar35 = ZEXT1664((undefined1  [16])0x0);
  auVar36 = ZEXT1664((undefined1  [16])0x0);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  auVar3 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar40 = ZEXT1664(auVar3);
  auVar3 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar41 = ZEXT1664(auVar3);
  auVar3 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar42 = ZEXT1664(auVar3);
  auVar3 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
  auVar43 = ZEXT1664(auVar3);
  auVar3 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar44 = ZEXT1664(auVar3);
  auVar24 = ZEXT1664((undefined1  [16])0x0);
  auVar26 = ZEXT1664((undefined1  [16])0x0);
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  auVar30 = ZEXT1664((undefined1  [16])0x0);
  auVar31 = ZEXT1664((undefined1  [16])0x0);
  auVar33 = ZEXT1664((undefined1  [16])0x0);
  auVar34 = ZEXT1664((undefined1  [16])0x0);
  iVar2 = 0;
  data_00 = data + uVar1;
  while( true ) {
    auVar14 = auVar34._0_32_;
    auVar15 = auVar33._0_32_;
    auVar32 = auVar31._0_32_;
    auVar29 = auVar30._0_32_;
    auVar27 = auVar28._0_32_;
    auVar25 = auVar26._0_32_;
    auVar23 = auVar24._0_32_;
    auVar21 = auVar22._0_32_;
    if (uVar1 == 0) break;
    auVar5 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x20));
    auVar6 = vmovdqu64_avx512vl(*(undefined1 (*) [32])data);
    auVar7 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x60));
    auVar8 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x40));
    iVar2 = iVar2 + 1;
    auVar9 = vpaddb_avx512vl(auVar5,auVar5);
    auVar5 = vpsrld_avx512vl(auVar5,1);
    auVar9 = vpternlogq_avx512vl(auVar9,auVar16,auVar6,0xe2);
    auVar5 = vpternlogq_avx512vl(auVar5,auVar37,auVar6,0xe2);
    auVar6 = vpaddb_avx512vl(auVar7,auVar7);
    auVar7 = vpsrld_avx512vl(auVar7,1);
    auVar7 = vpternlogq_avx512vl(auVar7,auVar37,auVar8,0xe2);
    auVar6 = vpternlogq_avx512vl(auVar6,auVar16,auVar8,0xe2);
    auVar8 = vpslld_avx512vl(auVar6,2);
    auVar10 = vpslld_avx512vl(auVar7,2);
    auVar6 = vpsrld_avx512vl(auVar6,2);
    auVar7 = vpsrld_avx512vl(auVar7,2);
    auVar6 = vpternlogq_avx512vl(auVar6,auVar17,auVar9,0xe2);
    auVar7 = vpternlogq_avx512vl(auVar7,auVar17,auVar5,0xe2);
    auVar8 = vpternlogq_avx512vl(auVar8,auVar18,auVar9,0xe2);
    auVar5 = vpternlogq_avx512vl(auVar10,auVar18,auVar5,0xe2);
    auVar9 = vpandq_avx512vl(auVar8,auVar38);
    auVar10 = vpandq_avx512vl(auVar5,auVar38);
    auVar11 = vpandq_avx512vl(auVar6,auVar38);
    auVar12 = vpandq_avx512vl(auVar7,auVar38);
    auVar8 = vpsrld_avx512vl(auVar8,4);
    auVar5 = vpsrld_avx512vl(auVar5,4);
    auVar6 = vpsrld_avx512vl(auVar6,4);
    auVar7 = vpsrld_avx512vl(auVar7,4);
    auVar8 = vpandq_avx512vl(auVar8,auVar38);
    auVar5 = vpandq_avx512vl(auVar5,auVar38);
    auVar6 = vpandq_avx512vl(auVar6,auVar38);
    auVar7 = vpandq_avx512vl(auVar7,auVar38);
    auVar9 = vpshufb_avx512vl(auVar4,auVar9);
    auVar10 = vpshufb_avx512vl(auVar4,auVar10);
    auVar11 = vpshufb_avx512vl(auVar4,auVar11);
    auVar12 = vpshufb_avx512vl(auVar4,auVar12);
    auVar8 = vpshufb_avx512vl(auVar4,auVar8);
    auVar5 = vpshufb_avx512vl(auVar4,auVar5);
    auVar6 = vpshufb_avx512vl(auVar4,auVar6);
    auVar7 = vpshufb_avx512vl(auVar4,auVar7);
    auVar9 = vpaddb_avx512vl(auVar9,auVar44._0_32_);
    auVar44 = ZEXT3264(auVar9);
    auVar10 = vpaddb_avx512vl(auVar10,auVar43._0_32_);
    auVar43 = ZEXT3264(auVar10);
    auVar11 = vpaddb_avx512vl(auVar11,auVar42._0_32_);
    auVar42 = ZEXT3264(auVar11);
    auVar12 = vpaddb_avx512vl(auVar12,auVar41._0_32_);
    auVar41 = ZEXT3264(auVar12);
    auVar8 = vpaddb_avx512vl(auVar8,auVar40._0_32_);
    auVar40 = ZEXT3264(auVar8);
    auVar5 = vpaddb_avx512vl(auVar5,auVar39._0_32_);
    auVar39 = ZEXT3264(auVar5);
    auVar13 = vpaddb_avx512vl(auVar6,auVar36._0_32_);
    auVar36 = ZEXT3264(auVar13);
    auVar7 = vpaddb_avx512vl(auVar7,auVar35._0_32_);
    auVar35 = ZEXT3264(auVar7);
    if (iVar2 == 0x3f) {
      auVar3 = vpxord_avx512vl(auVar6._0_16_,auVar6._0_16_);
      iVar2 = 0;
      auVar6 = vpsadbw_avx512vl(auVar9,ZEXT1632(auVar3));
      auVar9 = vpsadbw_avx512vl(auVar10,ZEXT1632(auVar3));
      auVar45 = ZEXT1632(auVar3);
      auVar10 = vpsadbw_avx512vl(auVar11,auVar45);
      auVar11 = vpsadbw_avx512vl(auVar12,auVar45);
      auVar8 = vpsadbw_avx512vl(auVar8,auVar45);
      auVar5 = vpsadbw_avx512vl(auVar5,auVar45);
      auVar12 = vpsadbw_avx512vl(auVar13,ZEXT1632(auVar3));
      auVar7 = vpsadbw_avx512vl(auVar7,ZEXT1632(auVar3));
      auVar14 = vpaddq_avx512vl(auVar6,auVar14);
      auVar34 = ZEXT3264(auVar14);
      auVar15 = vpaddq_avx512vl(auVar9,auVar15);
      auVar33 = ZEXT3264(auVar15);
      auVar15 = vpaddq_avx512vl(auVar10,auVar32);
      auVar31 = ZEXT3264(auVar15);
      auVar15 = vpaddq_avx512vl(auVar11,auVar29);
      auVar30 = ZEXT3264(auVar15);
      auVar15 = vpaddq_avx512vl(auVar8,auVar27);
      auVar28 = ZEXT3264(auVar15);
      auVar15 = vpaddq_avx2(auVar5,auVar25);
      auVar26 = ZEXT3264(auVar15);
      auVar15 = vpaddq_avx2(auVar12,auVar23);
      auVar24 = ZEXT3264(auVar15);
      auVar15 = vpaddq_avx2(auVar7,auVar21);
      auVar22 = ZEXT3264(auVar15);
      auVar35 = ZEXT1664((undefined1  [16])0x0);
      auVar36 = ZEXT1664((undefined1  [16])0x0);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      auVar3 = vpxord_avx512vl(auVar8._0_16_,auVar8._0_16_);
      auVar40 = ZEXT1664(auVar3);
      auVar3 = vpxord_avx512vl(auVar11._0_16_,auVar11._0_16_);
      auVar41 = ZEXT1664(auVar3);
      auVar3 = vpxord_avx512vl(auVar10._0_16_,auVar10._0_16_);
      auVar42 = ZEXT1664(auVar3);
      auVar3 = vpxord_avx512vl(auVar9._0_16_,auVar9._0_16_);
      auVar43 = ZEXT1664(auVar3);
      auVar3 = vpxord_avx512vl(auVar6._0_16_,auVar6._0_16_);
      auVar44 = ZEXT1664(auVar3);
    }
    data = (uint8_t *)((long)data + 0x80);
    uVar1 = uVar1 - 0x80;
  }
  if (iVar2 != 0) {
    auVar38 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar16 = vpsadbw_avx512vl(auVar43._0_32_,auVar38);
    auVar17 = vpsadbw_avx512vl(auVar42._0_32_,auVar38);
    auVar18 = vpsadbw_avx512vl(auVar44._0_32_,auVar38);
    auVar4 = vpsadbw_avx2(auVar36._0_32_,auVar38);
    auVar37 = vpsadbw_avx2(auVar35._0_32_,auVar38);
    auVar15 = vpaddq_avx2(auVar16,auVar15);
    auVar16 = vpsadbw_avx512vl(auVar41._0_32_,auVar38);
    auVar32 = vpaddq_avx2(auVar17,auVar32);
    auVar17 = vpsadbw_avx512vl(auVar40._0_32_,auVar38);
    auVar14 = vpaddq_avx2(auVar18,auVar14);
    auVar23 = vpaddq_avx2(auVar4,auVar23);
    auVar21 = vpaddq_avx2(auVar37,auVar21);
    auVar29 = vpaddq_avx2(auVar16,auVar29);
    auVar4 = vpsadbw_avx2(auVar39._0_32_,auVar38);
    auVar27 = vpaddq_avx2(auVar17,auVar27);
    auVar25 = vpaddq_avx2(auVar4,auVar25);
  }
  auVar3 = vpunpcklqdq_avx(auVar14._0_16_,auVar15._0_16_);
  uVar19 = auVar29._0_8_;
  auVar6._8_8_ = uVar19;
  auVar6._0_8_ = uVar19;
  auVar6._16_8_ = uVar19;
  auVar6._24_8_ = uVar19;
  auVar37 = vpermq_avx2(auVar32,0x55);
  auVar5._0_16_ = ZEXT116(0) * auVar32._0_16_ + ZEXT116(1) * auVar3;
  auVar5._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32._0_16_;
  auVar4 = vpblendd_avx2(auVar5,auVar6,0xc0);
  auVar3 = vpunpckhqdq_avx(auVar14._0_16_,auVar15._0_16_);
  auVar37 = vpblendd_avx2(ZEXT1632(auVar3),auVar37,0xf0);
  auVar20 = auVar21._0_16_;
  auVar7._0_16_ = ZEXT116(0) * auVar29._0_16_ + ZEXT116(1) * auVar20;
  auVar7._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar29._0_16_;
  auVar16 = vpblendd_avx2(auVar37,auVar7,0xc0);
  auVar37 = vpmovsxbq_avx2(ZEXT416(0x6020100));
  auVar4 = vpaddq_avx2(auVar4,auVar16);
  auVar16 = vpunpcklqdq_avx2(auVar14,auVar15);
  auVar17 = vpunpckhqdq_avx2(auVar14,auVar15);
  auVar16 = vperm2i128_avx2(auVar16,auVar32,0x31);
  auVar16 = vpermt2q_avx512vl(auVar16,auVar37,auVar29);
  auVar4 = vpaddq_avx2(auVar4,auVar16);
  auVar16 = vpmovsxbq_avx2(ZEXT416(0x7070302));
  auVar17 = vpermt2q_avx512vl(auVar17,auVar16,auVar32);
  uVar19 = auVar21._0_8_;
  auVar15._8_8_ = uVar19;
  auVar15._0_8_ = uVar19;
  auVar15._16_8_ = uVar19;
  auVar15._24_8_ = uVar19;
  auVar17 = vpblendd_avx2(auVar17,auVar29,0xc0);
  auVar18 = vpermq_avx2(auVar23,0x55);
  auVar4 = vpaddq_avx2(auVar4,auVar17);
  auVar3 = vpmovqd_avx512vl(auVar4);
  auVar3 = vpaddd_avx(auVar3,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar3;
  auVar3 = vpunpcklqdq_avx(auVar27._0_16_,auVar25._0_16_);
  auVar4._0_16_ = ZEXT116(0) * auVar23._0_16_ + ZEXT116(1) * auVar3;
  auVar4._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar23._0_16_;
  auVar4 = vpblendd_avx2(auVar4,auVar15,0xc0);
  auVar3 = vpunpckhqdq_avx(auVar27._0_16_,auVar25._0_16_);
  auVar17 = vpblendd_avx2(ZEXT1632(auVar3),auVar18,0xf0);
  auVar32._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar20;
  auVar32._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar20;
  auVar17 = vpblendd_avx2(auVar17,auVar32,0xc0);
  auVar4 = vpaddq_avx2(auVar4,auVar17);
  auVar18 = vpunpcklqdq_avx2(auVar27,auVar25);
  auVar17 = vpunpckhqdq_avx2(auVar27,auVar25);
  auVar18 = vperm2i128_avx2(auVar18,auVar23,0x31);
  auVar16 = vpermt2q_avx512vl(auVar17,auVar16,auVar23);
  auVar17 = vpermt2q_avx512vl(auVar18,auVar37,auVar21);
  auVar37 = vpblendd_avx2(auVar16,auVar21,0xc0);
  auVar4 = vpaddq_avx2(auVar4,auVar17);
  auVar4 = vpaddq_avx2(auVar4,auVar37);
  auVar3 = vpmovqd_avx512vl(auVar4);
  auVar3 = vpaddd_avx(auVar3,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar3;
  pospopcnt_u8_scalar_naive(data_00,(ulong)((uint)len & 0x7f),flag_counts);
  return;
}

Assistant:

void pospopcnt_u8_avx2_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    const __m256i popcnt_4bit = _mm256_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4,

        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m256i lo_nibble = _mm256_set1_epi8(0x0f);

    int local = 0;
    __m256i counter8bit_a = zero;
    __m256i counter8bit_b = zero;
    __m256i counter8bit_c = zero;
    __m256i counter8bit_d = zero;
    __m256i counter8bit_e = zero;
    __m256i counter8bit_f = zero;
    __m256i counter8bit_g = zero;
    __m256i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*32 - 1)]; data != end; data += 4*32) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m256i s0 = avx2_merge1_even(r0, r1);
        const __m256i s1 = avx2_merge1_odd (r0, r1);
        const __m256i s2 = avx2_merge1_even(r2, r3);
        const __m256i s3 = avx2_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m256i d0 = avx2_merge2_even(s0, s2);
        const __m256i d1 = avx2_merge2_even(s1, s3);
        const __m256i d2 = avx2_merge2_odd (s0, s2);
        const __m256i d3 = avx2_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i popcnt_a = _mm256_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m256i popcnt_e = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d0, 4) & lo_nibble);
        const __m256i popcnt_b = _mm256_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m256i popcnt_f = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d1, 4) & lo_nibble);
        const __m256i popcnt_c = _mm256_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m256i popcnt_g = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d2, 4) & lo_nibble);
        const __m256i popcnt_d = _mm256_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m256i popcnt_h = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm256_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm256_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm256_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm256_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm256_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm256_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm256_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm256_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm256_setzero_si256();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_b);
    flag_counts[2] += avx2_sum_epu64(counter_c);
    flag_counts[3] += avx2_sum_epu64(counter_d);
    flag_counts[4] += avx2_sum_epu64(counter_e);
    flag_counts[5] += avx2_sum_epu64(counter_f);
    flag_counts[6] += avx2_sum_epu64(counter_g);
    flag_counts[7] += avx2_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*32), flag_counts);
}